

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.h
# Opt level: O1

void COutPoint::
     SerializationOps<ParamsStream<HashWriter&,TransactionSerParams>,COutPoint_const,ActionSerialize>
               (uchar *obj,long s)

{
  long in_FS_OFFSET;
  undefined4 local_1c;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::Write(*(CSHA256 **)(s + 8),obj,0x20);
  local_1c = *(undefined4 *)(obj + 0x20);
  CSHA256::Write(*(CSHA256 **)(s + 8),(uchar *)&local_1c,4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(COutPoint, obj) { READWRITE(obj.hash, obj.n); }